

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,longlong value)

{
  type_conflict4 tVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> *this_00;
  ostream_iterator<char,_char,_std::char_traits<char>_> *this_01;
  uint64_t in_RSI;
  char *in_RDI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  ostream_type *local_40;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  uint64_t local_18;
  
  tVar1 = internal::is_negative<long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    local_18 = -in_RSI;
  }
  internal::count_digits(local_18);
  this_00 = reserve(in_stack_ffffffffffffffb0,(size_t)in_RDI);
  if (tVar1) {
    in_stack_ffffffffffffffd7 = 0x2d;
    this_01 = std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator++(this_00,0);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator*(this_01);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (&in_stack_ffffffffffffffb0->out_,in_RDI);
  }
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<char,_char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0,
             this_00);
  internal::
  format_decimal<char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long>
            (this_00,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  this_00->_M_stream = local_40;
  this_00->_M_string = (char *)CONCAT44(in_stack_ffffffffffffffcc,local_38);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }